

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm_x86.cpp
# Opt level: O3

int __thiscall
ncnn::GroupNorm_x86::forward_inplace(GroupNorm_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  ulong uVar2;
  float fVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  float *pfVar18;
  long lVar19;
  float *pfVar20;
  float *pfVar21;
  ulong uVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  __m128 _scale2;
  float fVar29;
  
  iVar12 = bottom_top_blob->dims;
  iVar17 = (this->super_GroupNorm).group;
  uVar2 = (long)(this->super_GroupNorm).channels / (long)iVar17;
  uVar8 = uVar2 & 0xffffffff;
  uVar7 = (uint)uVar2;
  if (iVar12 == 2) {
    if (0 < iVar17) {
      uVar4 = bottom_top_blob->w;
      uVar15 = uVar4 * uVar7;
      uVar14 = uVar15 & 0xfffffffc;
      lVar16 = 0;
      do {
        lVar19 = lVar16 * (int)uVar7;
        pfVar18 = (float *)(bottom_top_blob->w * lVar19 * bottom_top_blob->elemsize +
                           (long)bottom_top_blob->data);
        fVar23 = 0.0;
        fVar25 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        pfVar20 = pfVar18;
        fVar24 = 0.0;
        fVar28 = 0.0;
        uVar10 = 0;
        if (3 < (int)uVar15) {
          iVar12 = 3;
          do {
            fVar23 = fVar23 + *pfVar20;
            fVar25 = fVar25 + pfVar20[1];
            fVar26 = fVar26 + pfVar20[2];
            fVar27 = fVar27 + pfVar20[3];
            pfVar20 = pfVar20 + 4;
            iVar12 = iVar12 + 4;
            fVar24 = fVar23;
            fVar28 = fVar26;
            uVar10 = uVar14;
          } while (iVar12 < (int)uVar15);
        }
        fVar24 = fVar27 + fVar25 + fVar28 + fVar24;
        if (uVar15 - uVar10 != 0 && (int)uVar10 <= (int)uVar15) {
          lVar9 = 0;
          do {
            fVar24 = fVar24 + pfVar20[lVar9];
            lVar9 = lVar9 + 1;
          } while (uVar15 - uVar10 != (int)lVar9);
        }
        fVar24 = fVar24 * (1.0 / (float)(int)uVar15);
        pfVar20 = pfVar18;
        if ((int)uVar15 < 4) {
          fVar28 = 0.0;
          fVar23 = 0.0;
          fVar25 = 0.0;
          fVar26 = 0.0;
          uVar10 = 0;
        }
        else {
          fVar28 = 0.0;
          fVar23 = 0.0;
          fVar25 = 0.0;
          fVar26 = 0.0;
          iVar12 = 3;
          do {
            fVar28 = fVar28 + (*pfVar20 - fVar24) * (*pfVar20 - fVar24);
            fVar23 = fVar23 + (pfVar20[1] - fVar24) * (pfVar20[1] - fVar24);
            fVar25 = fVar25 + (pfVar20[2] - fVar24) * (pfVar20[2] - fVar24);
            fVar26 = fVar26 + (pfVar20[3] - fVar24) * (pfVar20[3] - fVar24);
            pfVar20 = pfVar20 + 4;
            iVar12 = iVar12 + 4;
            uVar10 = uVar14;
          } while (iVar12 < (int)uVar15);
        }
        fVar28 = fVar26 + fVar23 + fVar25 + fVar28;
        if (uVar15 - uVar10 != 0 && (int)uVar10 <= (int)uVar15) {
          lVar9 = 0;
          do {
            fVar28 = fVar28 + (pfVar20[lVar9] - fVar24) * (pfVar20[lVar9] - fVar24);
            lVar9 = lVar9 + 1;
          } while (uVar15 - uVar10 != (int)lVar9);
        }
        fVar28 = 1.0 / SQRT(fVar28 * (1.0 / (float)(int)uVar15) + (this->super_GroupNorm).eps);
        fVar24 = -fVar24 * fVar28;
        if ((this->super_GroupNorm).affine == 0) {
          uVar10 = 0;
          if (3 < (int)uVar15) {
            iVar12 = 3;
            do {
              *pfVar18 = *pfVar18 * fVar28 + fVar24;
              pfVar18[1] = pfVar18[1] * fVar28 + fVar24;
              pfVar18[2] = pfVar18[2] * fVar28 + fVar24;
              pfVar18[3] = pfVar18[3] * fVar28 + fVar24;
              pfVar18 = pfVar18 + 4;
              iVar12 = iVar12 + 4;
              uVar10 = uVar14;
            } while (iVar12 < (int)uVar15);
          }
          if (uVar15 - uVar10 != 0 && (int)uVar10 <= (int)uVar15) {
            lVar19 = 0;
            do {
              pfVar18[lVar19] = pfVar18[lVar19] * fVar28 + fVar24;
              lVar19 = lVar19 + 1;
            } while (uVar15 - uVar10 != (int)lVar19);
          }
        }
        else if (0 < (int)uVar7) {
          pfVar21 = (float *)((this->super_GroupNorm).gamma_data.elemsize * lVar19 +
                             (long)(this->super_GroupNorm).gamma_data.data);
          pfVar20 = (float *)(lVar19 * (this->super_GroupNorm).beta_data.elemsize +
                             (long)(this->super_GroupNorm).beta_data.data);
          uVar10 = 0;
          do {
            fVar25 = *pfVar21 * fVar28;
            fVar23 = *pfVar21 * fVar24 + *pfVar20;
            if ((int)uVar4 < 4) {
              uVar13 = 0;
            }
            else {
              iVar12 = 3;
              do {
                *pfVar18 = *pfVar18 * fVar25 + fVar23;
                pfVar18[1] = pfVar18[1] * fVar25 + fVar23;
                pfVar18[2] = pfVar18[2] * fVar25 + fVar23;
                pfVar18[3] = pfVar18[3] * fVar25 + fVar23;
                pfVar18 = pfVar18 + 4;
                iVar12 = iVar12 + 4;
                uVar13 = uVar4 & 0xfffffffc;
              } while (iVar12 < (int)uVar4);
            }
            iVar12 = uVar4 - uVar13;
            if (iVar12 != 0 && (int)uVar13 <= (int)uVar4) {
              do {
                *pfVar18 = *pfVar18 * fVar25 + fVar23;
                pfVar18 = pfVar18 + 1;
                iVar12 = iVar12 + -1;
              } while (iVar12 != 0);
            }
            pfVar21 = pfVar21 + 1;
            pfVar20 = pfVar20 + 1;
            uVar10 = uVar10 + 1;
          } while (uVar10 != uVar7);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < (this->super_GroupNorm).group);
    }
  }
  else if (iVar12 == 1) {
    if (0 < iVar17) {
      uVar4 = uVar7 & 0xfffffffc;
      lVar16 = 0;
      do {
        lVar19 = lVar16 * (int)uVar7;
        pfVar18 = (float *)(bottom_top_blob->elemsize * lVar19 + (long)bottom_top_blob->data);
        fVar23 = 0.0;
        fVar25 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        pfVar20 = pfVar18;
        fVar24 = 0.0;
        fVar28 = 0.0;
        uVar15 = 0;
        if (3 < (int)uVar7) {
          iVar12 = 3;
          do {
            fVar23 = fVar23 + *pfVar20;
            fVar25 = fVar25 + pfVar20[1];
            fVar26 = fVar26 + pfVar20[2];
            fVar27 = fVar27 + pfVar20[3];
            pfVar20 = pfVar20 + 4;
            iVar12 = iVar12 + 4;
            fVar24 = fVar23;
            fVar28 = fVar26;
            uVar15 = uVar4;
          } while (iVar12 < (int)uVar7);
        }
        fVar24 = fVar27 + fVar25 + fVar28 + fVar24;
        if ((int)uVar15 < (int)uVar7) {
          lVar9 = 0;
          do {
            fVar24 = fVar24 + pfVar20[lVar9];
            lVar9 = lVar9 + 1;
          } while (uVar7 - uVar15 != (int)lVar9);
        }
        fVar24 = fVar24 * (1.0 / (float)(int)uVar7);
        pfVar20 = pfVar18;
        if ((int)uVar7 < 4) {
          fVar28 = 0.0;
          fVar23 = 0.0;
          fVar25 = 0.0;
          fVar26 = 0.0;
          uVar15 = 0;
        }
        else {
          fVar28 = 0.0;
          fVar23 = 0.0;
          fVar25 = 0.0;
          fVar26 = 0.0;
          iVar12 = 3;
          do {
            fVar28 = fVar28 + (*pfVar20 - fVar24) * (*pfVar20 - fVar24);
            fVar23 = fVar23 + (pfVar20[1] - fVar24) * (pfVar20[1] - fVar24);
            fVar25 = fVar25 + (pfVar20[2] - fVar24) * (pfVar20[2] - fVar24);
            fVar26 = fVar26 + (pfVar20[3] - fVar24) * (pfVar20[3] - fVar24);
            pfVar20 = pfVar20 + 4;
            iVar12 = iVar12 + 4;
            uVar15 = uVar4;
          } while (iVar12 < (int)uVar7);
        }
        fVar28 = fVar26 + fVar23 + fVar25 + fVar28;
        if ((int)uVar15 < (int)uVar7) {
          lVar9 = 0;
          do {
            fVar28 = fVar28 + (pfVar20[lVar9] - fVar24) * (pfVar20[lVar9] - fVar24);
            lVar9 = lVar9 + 1;
          } while (uVar7 - uVar15 != (int)lVar9);
        }
        fVar28 = 1.0 / SQRT(fVar28 * (1.0 / (float)(int)uVar7) + (this->super_GroupNorm).eps);
        fVar24 = -fVar24 * fVar28;
        if ((this->super_GroupNorm).affine == 0) {
          uVar15 = 0;
          if (3 < (int)uVar7) {
            iVar12 = 3;
            do {
              *pfVar18 = *pfVar18 * fVar28 + fVar24;
              pfVar18[1] = pfVar18[1] * fVar28 + fVar24;
              pfVar18[2] = pfVar18[2] * fVar28 + fVar24;
              pfVar18[3] = pfVar18[3] * fVar28 + fVar24;
              pfVar18 = pfVar18 + 4;
              iVar12 = iVar12 + 4;
              uVar15 = uVar4;
            } while (iVar12 < (int)uVar7);
          }
          if ((int)uVar15 < (int)uVar7) {
            lVar19 = 0;
            do {
              pfVar18[lVar19] = pfVar18[lVar19] * fVar28 + fVar24;
              lVar19 = lVar19 + 1;
            } while (uVar7 - uVar15 != (int)lVar19);
          }
        }
        else {
          pfVar21 = (float *)((this->super_GroupNorm).gamma_data.elemsize * lVar19 +
                             (long)(this->super_GroupNorm).gamma_data.data);
          pfVar20 = (float *)(lVar19 * (this->super_GroupNorm).beta_data.elemsize +
                             (long)(this->super_GroupNorm).beta_data.data);
          uVar15 = 0;
          if (3 < (int)uVar7) {
            iVar12 = 3;
            do {
              fVar23 = pfVar21[1];
              fVar25 = pfVar21[2];
              fVar26 = pfVar21[3];
              fVar27 = pfVar20[1];
              fVar29 = pfVar20[2];
              fVar3 = pfVar20[3];
              *pfVar18 = (*pfVar18 * fVar28 + fVar24) * *pfVar21 + *pfVar20;
              pfVar18[1] = (pfVar18[1] * fVar28 + fVar24) * fVar23 + fVar27;
              pfVar18[2] = (pfVar18[2] * fVar28 + fVar24) * fVar25 + fVar29;
              pfVar18[3] = (pfVar18[3] * fVar28 + fVar24) * fVar26 + fVar3;
              pfVar21 = pfVar21 + 4;
              pfVar20 = pfVar20 + 4;
              pfVar18 = pfVar18 + 4;
              iVar12 = iVar12 + 4;
              uVar15 = uVar4;
            } while (iVar12 < (int)uVar7);
          }
          if ((int)uVar15 < (int)uVar7) {
            lVar19 = 0;
            do {
              pfVar18[lVar19] =
                   (pfVar18[lVar19] * fVar28 + fVar24) * pfVar21[lVar19] + pfVar20[lVar19];
              lVar19 = lVar19 + 1;
            } while (uVar7 - uVar15 != (int)lVar19);
          }
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < (this->super_GroupNorm).group);
    }
  }
  else if ((iVar12 - 3U < 2) && (0 < iVar17)) {
    uVar15 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    uVar4 = uVar15 & 0xfffffffc;
    fVar24 = 1.0 / (float)(int)(uVar15 * uVar7);
    lVar16 = 0;
    do {
      lVar19 = lVar16 * (int)uVar7;
      uVar2 = bottom_top_blob->elemsize;
      lVar9 = bottom_top_blob->cstep * lVar19 * uVar2;
      pvVar1 = bottom_top_blob->data;
      uVar5 = ((long)bottom_top_blob->d * uVar2 *
               (long)bottom_top_blob->h * (long)bottom_top_blob->w + 0xf & 0xfffffffffffffff0) /
              uVar2;
      if ((int)uVar7 < 1) {
        fVar28 = 0.0;
LAB_0050ba36:
        fVar23 = 0.0;
      }
      else {
        lVar6 = uVar5 * uVar2;
        fVar28 = 0.0;
        uVar22 = 0;
        do {
          pfVar20 = (float *)((long)pvVar1 + lVar6 * uVar22 + lVar9);
          if ((int)uVar15 < 4) {
            fVar23 = 0.0;
            fVar25 = 0.0;
            fVar26 = 0.0;
            fVar27 = 0.0;
            uVar14 = 0;
          }
          else {
            fVar23 = 0.0;
            fVar25 = 0.0;
            fVar26 = 0.0;
            fVar27 = 0.0;
            iVar12 = 3;
            do {
              fVar23 = fVar23 + *pfVar20;
              fVar25 = fVar25 + pfVar20[1];
              fVar26 = fVar26 + pfVar20[2];
              fVar27 = fVar27 + pfVar20[3];
              pfVar20 = pfVar20 + 4;
              iVar12 = iVar12 + 4;
              uVar14 = uVar4;
            } while (iVar12 < (int)uVar15);
          }
          fVar28 = fVar27 + fVar25 + fVar28 + fVar26 + fVar23;
          if (uVar15 - uVar14 != 0 && (int)uVar14 <= (int)uVar15) {
            lVar11 = 0;
            do {
              fVar28 = fVar28 + pfVar20[lVar11];
              lVar11 = lVar11 + 1;
            } while (uVar15 - uVar14 != (int)lVar11);
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 != uVar8);
        fVar28 = fVar28 * fVar24;
        if ((int)uVar7 < 1) goto LAB_0050ba36;
        fVar23 = 0.0;
        uVar22 = 0;
        do {
          pfVar20 = (float *)((long)pvVar1 + lVar6 * uVar22 + lVar9);
          if ((int)uVar15 < 4) {
            fVar25 = 0.0;
            fVar26 = 0.0;
            fVar27 = 0.0;
            fVar29 = 0.0;
            uVar14 = 0;
          }
          else {
            fVar25 = 0.0;
            fVar26 = 0.0;
            fVar27 = 0.0;
            fVar29 = 0.0;
            iVar12 = 3;
            do {
              fVar25 = fVar25 + (*pfVar20 - fVar28) * (*pfVar20 - fVar28);
              fVar26 = fVar26 + (pfVar20[1] - fVar28) * (pfVar20[1] - fVar28);
              fVar27 = fVar27 + (pfVar20[2] - fVar28) * (pfVar20[2] - fVar28);
              fVar29 = fVar29 + (pfVar20[3] - fVar28) * (pfVar20[3] - fVar28);
              pfVar20 = pfVar20 + 4;
              iVar12 = iVar12 + 4;
              uVar14 = uVar4;
            } while (iVar12 < (int)uVar15);
          }
          fVar23 = fVar29 + fVar26 + fVar23 + fVar27 + fVar25;
          if (uVar15 - uVar14 != 0 && (int)uVar14 <= (int)uVar15) {
            lVar11 = 0;
            do {
              fVar23 = fVar23 + (pfVar20[lVar11] - fVar28) * (pfVar20[lVar11] - fVar28);
              lVar11 = lVar11 + 1;
            } while (uVar15 - uVar14 != (int)lVar11);
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 != uVar8);
      }
      if (0 < (int)uVar7) {
        pfVar20 = (float *)((this->super_GroupNorm).gamma_data.elemsize * lVar19 +
                           (long)(this->super_GroupNorm).gamma_data.data);
        pfVar18 = (float *)(lVar19 * (this->super_GroupNorm).beta_data.elemsize +
                           (long)(this->super_GroupNorm).beta_data.data);
        fVar23 = 1.0 / SQRT(fVar23 * fVar24 + (this->super_GroupNorm).eps);
        uVar22 = 0;
        do {
          fVar25 = -fVar28 * fVar23;
          fVar26 = fVar23;
          if ((this->super_GroupNorm).affine != 0) {
            fVar26 = *pfVar20 * fVar23;
            fVar25 = *pfVar20 * -fVar28 * fVar23 + *pfVar18;
          }
          pfVar21 = (float *)((long)pvVar1 + uVar5 * uVar2 * uVar22 + lVar9);
          uVar14 = 0;
          if (3 < (int)uVar15) {
            iVar12 = 3;
            do {
              *pfVar21 = *pfVar21 * fVar26 + fVar25;
              pfVar21[1] = pfVar21[1] * fVar26 + fVar25;
              pfVar21[2] = pfVar21[2] * fVar26 + fVar25;
              pfVar21[3] = pfVar21[3] * fVar26 + fVar25;
              pfVar21 = pfVar21 + 4;
              iVar12 = iVar12 + 4;
              uVar14 = uVar4;
            } while (iVar12 < (int)uVar15);
          }
          if (uVar15 - uVar14 != 0 && (int)uVar14 <= (int)uVar15) {
            lVar19 = 0;
            do {
              pfVar21[lVar19] = pfVar21[lVar19] * fVar26 + fVar25;
              lVar19 = lVar19 + 1;
            } while (uVar15 - uVar14 != (int)lVar19);
          }
          pfVar20 = pfVar20 + 1;
          pfVar18 = pfVar18 + 1;
          uVar22 = uVar22 + 1;
        } while (uVar22 != uVar8);
        iVar17 = (this->super_GroupNorm).group;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < iVar17);
  }
  return 0;
}

Assistant:

int GroupNorm_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int channels_per_group = channels / group;

    if (dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < channels_per_group; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < channels_per_group; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < channels_per_group; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / channels_per_group;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / channels_per_group + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                int i = 0;
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _gamma = _mm512_loadu_ps(gamma);
                    __m512 _beta = _mm512_loadu_ps(beta);
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _a = _mm512_mul_ps(_gamma, _scale1_avx512);
                    __m512 _b = _mm512_add_ps(_mm512_mul_ps(_gamma, _scale2_avx512), _beta);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a), _b);
                    _mm512_storeu_ps(ptr, _p);
                    gamma += 16;
                    beta += 16;
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _gamma = _mm256_loadu_ps(gamma);
                    __m256 _beta = _mm256_loadu_ps(beta);
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _a = _mm256_mul_ps(_gamma, _scale1_avx);
                    __m256 _b = _mm256_comp_fmadd_ps(_gamma, _scale2_avx, _beta);
                    _p = _mm256_comp_fmadd_ps(_p, _a, _b);
                    _mm256_storeu_ps(ptr, _p);
                    gamma += 8;
                    beta += 8;
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _gamma = _mm_loadu_ps(gamma);
                    __m128 _beta = _mm_loadu_ps(beta);
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _a = _mm_mul_ps(_gamma, _scale1);
                    __m128 _b = _mm_comp_fmadd_ps(_gamma, _scale2, _beta);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    gamma += 4;
                    beta += 4;
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    *ptr = *ptr * a + b;
                    gamma++;
                    beta++;
                    ptr++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int size = channels_per_group * w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.row_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / size;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / size + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
                for (int q = 0; q < channels_per_group; q++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _a_avx512 = _mm512_set1_ps(a);
                    __m512 _b_avx512 = _mm512_set1_ps(b);
                    for (; i + 15 < w; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                        _mm512_storeu_ps(ptr, _p);
                        ptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _a_avx = _mm256_set1_ps(a);
                    __m256 _b_avx = _mm256_set1_ps(b);
                    for (; i + 7 < w; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                        _mm256_storeu_ps(ptr, _p);
                        ptr += 8;
                    }
#endif // __AVX__
                    __m128 _a = _mm_set1_ps(a);
                    __m128 _b = _mm_set1_ps(b);
                    for (; i + 3 < w; i += 4)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_comp_fmadd_ps(_p, _a, _b);
                        _mm_storeu_ps(ptr, _p);
                        ptr += 4;
                    }
#endif // __SSE2__
                    for (; i < w; i++)
                    {
                        *ptr = *ptr * a + b;
                        ptr++;
                    }
                    gamma++;
                    beta++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 3 || dims == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int d = bottom_top_blob.d;
        int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / (channels_per_group * size);

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / (channels_per_group * size) + eps);
            float scale2 = -mean * scale1;

            const float* gamma = gamma_data_g;
            const float* beta = beta_data_g;
            for (int q = 0; q < channels_per_group; q++)
            {
                float a = scale1;
                float b = scale2;
                if (affine)
                {
                    a = *gamma * a;
                    b = *gamma * b + *beta;
                }

                float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _a_avx512 = _mm512_set1_ps(a);
                __m512 _b_avx512 = _mm512_set1_ps(b);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _a_avx = _mm256_set1_ps(a);
                __m256 _b_avx = _mm256_set1_ps(b);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _a = _mm_set1_ps(a);
                __m128 _b = _mm_set1_ps(b);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * a + b;
                    ptr++;
                }

                gamma++;
                beta++;
            }
        }

        return 0;
    }

    return 0;
}